

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_enum.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::EnumGenerator::Generate(EnumGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  int iVar2;
  string *psVar3;
  EnumValueDescriptor *pEVar4;
  string *enum_value_name;
  LogMessage *pLVar5;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar7;
  string local_1b0;
  string local_190;
  _Base_ptr local_170;
  byte local_168;
  _Base_ptr local_160;
  byte local_158;
  uint local_150;
  LogFinisher local_149;
  int number;
  _Base_ptr local_110;
  byte local_108;
  _Base_ptr local_100;
  byte local_f8;
  undefined1 local_f0 [8];
  string name;
  string original_name;
  undefined1 local_a8 [4];
  int i;
  set<int,_std::less<int>,_std::allocator<int>_> used_number;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  used_names;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  EnumGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  WriteEnumDocComment(printer,this->descriptor_);
  pPVar1 = local_18;
  SourceGeneratorBase::class_access_level_abi_cxx11_(&local_38,&this->super_SourceGeneratorBase);
  psVar3 = EnumDescriptor::name_abi_cxx11_(this->descriptor_);
  io::Printer::Print(pPVar1,"$access_level$ enum $name$ {\n","access_level",&local_38,"name",psVar3)
  ;
  std::__cxx11::string::~string((string *)&local_38);
  io::Printer::Indent(local_18);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&used_number._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_a8);
  original_name.field_2._12_4_ = 0;
  while( true ) {
    iVar2 = EnumDescriptor::value_count(this->descriptor_);
    pPVar1 = local_18;
    if (iVar2 <= (int)original_name.field_2._12_4_) break;
    pEVar4 = EnumDescriptor::value(this->descriptor_,original_name.field_2._12_4_);
    WriteEnumValueDocComment(pPVar1,pEVar4);
    pEVar4 = EnumDescriptor::value(this->descriptor_,original_name.field_2._12_4_);
    psVar3 = EnumValueDescriptor::name_abi_cxx11_(pEVar4);
    std::__cxx11::string::string((string *)(name.field_2._M_local_buf + 8),(string *)psVar3);
    psVar3 = EnumDescriptor::name_abi_cxx11_(this->descriptor_);
    pEVar4 = EnumDescriptor::value(this->descriptor_,original_name.field_2._12_4_);
    enum_value_name = EnumValueDescriptor::name_abi_cxx11_(pEVar4);
    GetEnumValueName((string *)local_f0,psVar3,enum_value_name);
    while( true ) {
      pVar6 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&used_number._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (value_type *)local_f0);
      local_110 = (_Base_ptr)pVar6.first._M_node;
      local_108 = pVar6.second;
      local_100 = local_110;
      local_f8 = local_108;
      if (((local_108 ^ 0xff) & 1) == 0) break;
      internal::LogMessage::LogMessage
                ((LogMessage *)&number,LOGLEVEL_WARNING,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/csharp/csharp_enum.cc"
                 ,0x4c);
      pLVar5 = internal::LogMessage::operator<<((LogMessage *)&number,"Duplicate enum value ");
      pLVar5 = internal::LogMessage::operator<<(pLVar5,(string *)local_f0);
      pLVar5 = internal::LogMessage::operator<<(pLVar5," (originally ");
      pLVar5 = internal::LogMessage::operator<<(pLVar5,(string *)((long)&name.field_2 + 8));
      pLVar5 = internal::LogMessage::operator<<(pLVar5,") in ");
      psVar3 = EnumDescriptor::name_abi_cxx11_(this->descriptor_);
      pLVar5 = internal::LogMessage::operator<<(pLVar5,psVar3);
      pLVar5 = internal::LogMessage::operator<<(pLVar5,"; adding underscore to distinguish");
      internal::LogFinisher::operator=(&local_149,pLVar5);
      internal::LogMessage::~LogMessage((LogMessage *)&number);
      std::__cxx11::string::operator+=((string *)local_f0,"_");
    }
    pEVar4 = EnumDescriptor::value(this->descriptor_,original_name.field_2._12_4_);
    local_150 = EnumValueDescriptor::number(pEVar4);
    pVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)local_a8,
                       (value_type_conflict1 *)&local_150);
    pPVar1 = local_18;
    local_170 = (_Base_ptr)pVar7.first._M_node;
    local_168 = pVar7.second;
    local_160 = local_170;
    local_158 = local_168;
    if (((local_168 ^ 0xff) & 1) == 0) {
      SimpleItoa_abi_cxx11_(&local_1b0,(protobuf *)(ulong)local_150,pVar7._8_4_);
      io::Printer::Print(pPVar1,"[pbr::OriginalName(\"$original_name$\")] $name$ = $number$,\n",
                         "original_name",(string *)((long)&name.field_2 + 8),"name",
                         (string *)local_f0,"number",&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
    }
    else {
      SimpleItoa_abi_cxx11_(&local_190,(protobuf *)(ulong)local_150,pVar7._8_4_);
      io::Printer::Print(pPVar1,
                         "[pbr::OriginalName(\"$original_name$\", PreferredAlias = false)] $name$ = $number$,\n"
                         ,"original_name",(string *)((long)&name.field_2 + 8),"name",
                         (string *)local_f0,"number",&local_190);
      std::__cxx11::string::~string((string *)&local_190);
    }
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
    original_name.field_2._12_4_ = original_name.field_2._12_4_ + 1;
  }
  io::Printer::Outdent(local_18);
  io::Printer::Print(local_18,"}\n");
  io::Printer::Print(local_18,"\n");
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_a8);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&used_number._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void EnumGenerator::Generate(io::Printer* printer) {
  WriteEnumDocComment(printer, descriptor_);
  printer->Print("$access_level$ enum $name$ {\n",
                 "access_level", class_access_level(),
                 "name", descriptor_->name());
  printer->Indent();
  std::set<string> used_names;
  std::set<int> used_number;
  for (int i = 0; i < descriptor_->value_count(); i++) {
      WriteEnumValueDocComment(printer, descriptor_->value(i));
      string original_name = descriptor_->value(i)->name();
      string name = GetEnumValueName(descriptor_->name(), descriptor_->value(i)->name());
      // Make sure we don't get any duplicate names due to prefix removal.
      while (!used_names.insert(name).second) {
        // It's possible we'll end up giving this warning multiple times, but that's better than not at all.
        GOOGLE_LOG(WARNING) << "Duplicate enum value " << name << " (originally " << original_name
          << ") in " << descriptor_->name() << "; adding underscore to distinguish";
        name += "_";
      }
      int number = descriptor_->value(i)->number();
      if (!used_number.insert(number).second) {
          printer->Print("[pbr::OriginalName(\"$original_name$\", PreferredAlias = false)] $name$ = $number$,\n",
             "original_name", original_name,
             "name", name,
             "number", SimpleItoa(number));
      } else {
          printer->Print("[pbr::OriginalName(\"$original_name$\")] $name$ = $number$,\n",
             "original_name", original_name,
             "name", name,
             "number", SimpleItoa(number));
      }
  }
  printer->Outdent();
  printer->Print("}\n");
  printer->Print("\n");
}